

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.cpp
# Opt level: O0

IConnection * __thiscall
tonk::ConnectionAddrMap::FindByAddr(ConnectionAddrMap *this,UDPAddress *addr)

{
  bool bVar1;
  uint index_00;
  node *pnVar2;
  LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
  *this_00;
  long in_RDI;
  IConnection *connection;
  Locker locker;
  int index;
  Lock *in_stack_ffffffffffffff78;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  IConnection *local_48;
  IConnection *local_10;
  
  Locker::Locker((Locker *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar1 = asio::ip::operator==
                    (in_stack_ffffffffffffff80,
                     (basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffff78);
  if (bVar1) {
    local_48 = *(IConnection **)(in_RDI + 0x70);
  }
  else {
    this_00 = (LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
               *)(in_RDI + 0x30);
    index_00 = LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
               ::find_index((LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
                             *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            (basic_endpoint<asio::ip::udp> *)this_00);
    if ((int)index_00 < 0) {
      local_10 = (IConnection *)0x0;
    }
    else {
      pnVar2 = LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
               ::get_node(this_00,index_00);
      local_10 = (pnVar2->super_value_type).second;
    }
    local_48 = local_10;
    if (local_10 != (IConnection *)0x0) {
      asio::ip::basic_endpoint<asio::ip::udp>::operator=
                (in_stack_ffffffffffffff80,
                 (basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffff78);
      *(IConnection **)(in_RDI + 0x70) = local_10;
    }
  }
  if (local_48 != (IConnection *)0x0) {
    std::__atomic_base<int>::operator++(&(local_48->SelfRefCount).RefCount.super___atomic_base<int>)
    ;
  }
  Locker::~Locker((Locker *)0x1de000);
  return local_48;
}

Assistant:

IConnection* ConnectionAddrMap::FindByAddr(const UDPAddress& addr)
{
    TONK_DEBUG_ASSERT(!addr.address().is_unspecified());

    Locker locker(AddressMapLock);

    IConnection* connection;

    if (addr == RecentAddress) {
        connection = RecentConnection;
    }
    else
    {
        connection = AddressMap.Find(addr);
        if (connection)
        {
            RecentAddress = addr;
            RecentConnection = connection;
        }
    }

    if (connection) {
        connection->SelfRefCount.IncrementReferences();
    }
    return connection;
}